

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_across_lanes(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  long lVar1;
  bool bVar2;
  _Bool _Var3;
  uint32_t reg;
  uint32_t rn_00;
  uint32_t uVar4;
  uint32_t uVar5;
  int esize_00;
  uint uVar6;
  MemOp MVar7;
  TCGv_i64 ret;
  TCGv_i64 arg;
  TCGv_ptr fpst_00;
  TCGv_i32 arg_00;
  int size_00;
  bool bVar8;
  bool bVar9;
  TCGv_i32 tcg_res32;
  int vmap;
  int fpopcode;
  TCGv_ptr fpst;
  TCGv_i64 tcg_elt;
  TCGv_i64 tcg_res;
  int i;
  int elements;
  int esize;
  _Bool is_min;
  _Bool is_fp;
  _Bool is_u;
  _Bool is_q;
  int opcode;
  int size;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  _is_min = extract32(insn,0x16,2);
  uVar4 = extract32(insn,0xc,5);
  uVar5 = extract32(insn,0x1e,1);
  bVar8 = uVar5 != 0;
  uVar5 = extract32(insn,0x1d,1);
  bVar9 = uVar5 != 0;
  bVar2 = false;
  elements._0_1_ = false;
  if ((uVar4 != 3) && (uVar4 != 10)) {
    if ((uVar4 == 0xc) || (uVar4 == 0xf)) {
      uVar5 = extract32(_is_min,1,1);
      elements._0_1_ = uVar5 != 0;
      bVar2 = true;
      if ((bVar9) || (_Var3 = isar_feature_aa64_fp16(s->isar), !_Var3)) {
        if ((!bVar9) || ((!bVar8 || (uVar5 = extract32(_is_min,0,1), uVar5 != 0)))) {
          unallocated_encoding_aarch64(s);
          return;
        }
        _is_min = MO_32;
      }
      else {
        _is_min = MO_16;
      }
      goto LAB_00831623;
    }
    if (uVar4 != 0x1a) {
      if (uVar4 != 0x1b) {
        unallocated_encoding_aarch64(s);
        return;
      }
      if (bVar9) {
        unallocated_encoding_aarch64(s);
        return;
      }
    }
  }
  if ((_is_min == MO_64) || ((_is_min == MO_32 && (!bVar8)))) {
    unallocated_encoding_aarch64(s);
    return;
  }
LAB_00831623:
  _Var3 = fp_access_check(s);
  if (_Var3) {
    esize_00 = 8 << ((byte)_is_min & 0x1f);
    uVar6 = 0x40;
    if (bVar8) {
      uVar6 = 0x80;
    }
    lVar1 = (long)(ulong)uVar6 / (long)esize_00;
    ret = tcg_temp_new_i64(tcg_ctx_00);
    arg = tcg_temp_new_i64(tcg_ctx_00);
    if (bVar2) {
      fpst_00 = get_fpstatus_ptr_aarch64(tcg_ctx_00,_is_min == MO_16);
      size_00 = 0x40;
      if (bVar8) {
        size_00 = 0x80;
      }
      arg_00 = do_reduction_op(s,uVar4 | (uint)elements._0_1_ << 4 | (uint)bVar9 << 5,rn_00,esize_00
                               ,size_00,(1 << ((byte)lVar1 & 0x1f)) + -1,fpst_00);
      tcg_gen_extu_i32_i64_aarch64(tcg_ctx_00,ret,arg_00);
      tcg_temp_free_i32(tcg_ctx_00,arg_00);
      tcg_temp_free_ptr(tcg_ctx_00,fpst_00);
    }
    else {
      MVar7 = MO_ASHIFT;
      if (bVar9) {
        MVar7 = MO_8;
      }
      read_vec_element(s,ret,rn_00,0,_is_min | MVar7);
      for (tcg_res._0_4_ = 1; (int)tcg_res < (int)lVar1; tcg_res._0_4_ = (int)tcg_res + 1) {
        read_vec_element(s,arg,rn_00,(int)tcg_res,_is_min | ((byte)~bVar9 & 1) << 2);
        if (0x17 < uVar4 - 3 && uVar4 != 0x1b) {
LAB_00831790:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x1d9a,(char *)0x0);
        }
        switch((long)&switchD_0083170d::switchdataD_0137b9c0 +
               (long)(int)(&switchD_0083170d::switchdataD_0137b9c0)[uVar4 - 3]) {
        case 0x83170f:
          tcg_gen_add_i64(tcg_ctx_00,ret,ret,arg);
          break;
        case 0x831726:
          if (bVar9) {
            tcg_gen_umax_i64_aarch64(tcg_ctx_00,ret,ret,arg);
          }
          else {
            tcg_gen_smax_i64_aarch64(tcg_ctx_00,ret,ret,arg);
          }
          break;
        case 0x83175a:
          if (bVar9) {
            tcg_gen_umin_i64_aarch64(tcg_ctx_00,ret,ret,arg);
          }
          else {
            tcg_gen_smin_i64_aarch64(tcg_ctx_00,ret,ret,arg);
          }
          break;
        case 0x83178e:
          goto LAB_00831790;
        }
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,arg);
    if (uVar4 == 3) {
      _is_min = _is_min + MO_16;
    }
    switch(_is_min) {
    case MO_8:
      tcg_gen_ext8u_i64_aarch64(tcg_ctx_00,ret,ret);
      break;
    case MO_16:
      tcg_gen_ext16u_i64_aarch64(tcg_ctx_00,ret,ret);
      break;
    case MO_32:
      tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,ret,ret);
      break;
    case MO_64:
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x1dc3,(char *)0x0);
    }
    write_fp_dreg_aarch64(s,reg,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  return;
}

Assistant:

static void disas_simd_across_lanes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    bool is_q = extract32(insn, 30, 1);
    bool is_u = extract32(insn, 29, 1);
    bool is_fp = false;
    bool is_min = false;
    int esize;
    int elements;
    int i;
    TCGv_i64 tcg_res, tcg_elt;

    switch (opcode) {
    case 0x1b: /* ADDV */
        if (is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x3: /* SADDLV, UADDLV */
    case 0xa: /* SMAXV, UMAXV */
    case 0x1a: /* SMINV, UMINV */
        if (size == 3 || (size == 2 && !is_q)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0xc: /* FMAXNMV, FMINNMV */
    case 0xf: /* FMAXV, FMINV */
        /* Bit 1 of size field encodes min vs max and the actual size
         * depends on the encoding of the U bit. If not set (and FP16
         * enabled) then we do half-precision float instead of single
         * precision.
         */
        is_min = extract32(size, 1, 1);
        is_fp = true;
        if (!is_u && dc_isar_feature(aa64_fp16, s)) {
            size = 1;
        } else if (!is_u || !is_q || extract32(size, 0, 1)) {
            unallocated_encoding(s);
            return;
        } else {
            size = 2;
        }
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    esize = 8 << size;
    elements = (is_q ? 128 : 64) / esize;

    tcg_res = tcg_temp_new_i64(tcg_ctx);
    tcg_elt = tcg_temp_new_i64(tcg_ctx);

    /* These instructions operate across all lanes of a vector
     * to produce a single result. We can guarantee that a 64
     * bit intermediate is sufficient:
     *  + for [US]ADDLV the maximum element size is 32 bits, and
     *    the result type is 64 bits
     *  + for FMAX*V, FMIN*V, ADDV the intermediate type is the
     *    same as the element size, which is 32 bits at most
     * For the integer operations we can choose to work at 64
     * or 32 bits and truncate at the end; for simplicity
     * we use 64 bits always. The floating point
     * ops do require 32 bit intermediates, though.
     */
    if (!is_fp) {
        read_vec_element(s, tcg_res, rn, 0, size | (is_u ? 0 : MO_SIGN));

        for (i = 1; i < elements; i++) {
            read_vec_element(s, tcg_elt, rn, i, size | (is_u ? 0 : MO_SIGN));

            switch (opcode) {
            case 0x03: /* SADDLV / UADDLV */
            case 0x1b: /* ADDV */
                tcg_gen_add_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                break;
            case 0x0a: /* SMAXV / UMAXV */
                if (is_u) {
                    tcg_gen_umax_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                } else {
                    tcg_gen_smax_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                }
                break;
            case 0x1a: /* SMINV / UMINV */
                if (is_u) {
                    tcg_gen_umin_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                } else {
                    tcg_gen_smin_i64(tcg_ctx, tcg_res, tcg_res, tcg_elt);
                }
                break;
            default:
                g_assert_not_reached();
            }

        }
    } else {
        /* Floating point vector reduction ops which work across 32
         * bit (single) or 16 bit (half-precision) intermediates.
         * Note that correct NaN propagation requires that we do these
         * operations in exactly the order specified by the pseudocode.
         */
        TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, size == MO_16);
        int fpopcode = opcode | is_min << 4 | is_u << 5;
        int vmap = (1 << elements) - 1;
        TCGv_i32 tcg_res32 = do_reduction_op(s, fpopcode, rn, esize,
                                             (is_q ? 128 : 64), vmap, fpst);
        tcg_gen_extu_i32_i64(tcg_ctx, tcg_res, tcg_res32);
        tcg_temp_free_i32(tcg_ctx, tcg_res32);
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }

    tcg_temp_free_i64(tcg_ctx, tcg_elt);

    /* Now truncate the result to the width required for the final output */
    if (opcode == 0x03) {
        /* SADDLV, UADDLV: result is 2*esize */
        size++;
    }

    switch (size) {
    case 0:
        tcg_gen_ext8u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 1:
        tcg_gen_ext16u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 2:
        tcg_gen_ext32u_i64(tcg_ctx, tcg_res, tcg_res);
        break;
    case 3:
        break;
    default:
        g_assert_not_reached();
    }

    write_fp_dreg(s, rd, tcg_res);
    tcg_temp_free_i64(tcg_ctx, tcg_res);
}